

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O3

void __thiscall
chrono::curiosity::CuriosityChassis::CuriosityChassis
          (CuriosityChassis *this,string *name,CuriosityChassisType chassis_type,
          shared_ptr<chrono::ChMaterialSurface> *mat)

{
  undefined8 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  char *pcVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  shared_ptr<chrono::ChMaterialSurface> local_e8;
  ChQuaternion<double> local_d0;
  undefined1 local_b0 [8];
  undefined1 local_a8 [32];
  double local_88;
  double dStack_80;
  double local_78;
  ChMatrix33<double> local_70;
  
  auVar5._8_8_ = _UpdateForces;
  auVar5._0_8_ = _UpdateForces;
  auVar5._16_8_ = _UpdateForces;
  auVar5._24_8_ = _UpdateForces;
  local_b0 = (undefined1  [8])&PTR__ChFrame_0017db90;
  auVar5 = vblendps_avx(ZEXT1632(_VNULL),auVar5,0x30);
  auVar6._8_8_ = QUNIT;
  auVar6._0_8_ = QUNIT;
  auVar6._16_8_ = QUNIT;
  auVar6._24_8_ = QUNIT;
  local_a8 = vblendps_avx(auVar5,auVar6,0xc0);
  local_88 = _ChLinkMotorRotationSpeed;
  dStack_80 = _ChBody;
  local_78 = _ComputeMassProperties;
  ChMatrix33<double>::ChMatrix33(&local_70,(ChQuaternion<double> *)&QUNIT);
  local_e8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_e8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  p_Var2 = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  CuriosityPart::CuriosityPart
            (&this->super_CuriosityPart,name,(ChFrame<double> *)local_b0,&local_e8,false);
  if (local_e8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_CuriosityPart)._vptr_CuriosityPart = (_func_int **)&PTR__CuriosityPart_0017e998;
  *(CuriosityChassisType *)&(this->super_CuriosityPart).field_0x234 = chassis_type;
  if (chassis_type == FullRover) {
    (this->super_CuriosityPart).m_mass = 750.0;
    (this->super_CuriosityPart).m_inertia.m_data[0] = 637.5;
    (this->super_CuriosityPart).m_inertia.m_data[1] = 637.5;
    (this->super_CuriosityPart).m_inertia.m_data[2] = 750.0;
    local_d0.m_data[0] = 1.0;
    local_b0 = (undefined1  [8])&PTR__ChFrame_0017db90;
    local_d0.m_data[3] = 0.0;
    local_a8._16_8_ = 0;
    local_a8._0_16_ = ZEXT816(0);
    local_a8._24_8_ = 0x3ff0000000000000;
    local_d0.m_data[1] = 0.0;
    local_d0.m_data[2] = 0.0;
    local_88 = 0.0;
    dStack_80 = 0.0;
    local_78 = 0.0;
    ChMatrix33<double>::ChMatrix33(&local_70,&local_d0);
    ChFrame<double>::operator=(&(this->super_CuriosityPart).m_cog,(ChFrame<double> *)local_b0);
    pcVar3 = "curiosity_chassis";
  }
  else {
    if (chassis_type != Scarecrow) goto LAB_00150b3f;
    (this->super_CuriosityPart).m_mass = 200.0;
    (this->super_CuriosityPart).m_inertia.m_data[0] = 80.0;
    (this->super_CuriosityPart).m_inertia.m_data[1] = 80.0;
    (this->super_CuriosityPart).m_inertia.m_data[2] = 100.0;
    local_d0.m_data[0] = 1.0;
    local_b0 = (undefined1  [8])&PTR__ChFrame_0017db90;
    local_d0.m_data[3] = 0.0;
    local_a8._16_8_ = 0;
    local_a8._0_16_ = ZEXT816(0);
    local_a8._24_8_ = 0x3ff0000000000000;
    local_d0.m_data[1] = 0.0;
    local_d0.m_data[2] = 0.0;
    local_88 = 0.0;
    dStack_80 = 0.0;
    local_78 = 0.0;
    ChMatrix33<double>::ChMatrix33(&local_70,&local_d0);
    ChFrame<double>::operator=(&(this->super_CuriosityPart).m_cog,(ChFrame<double> *)local_b0);
    pcVar3 = "scarecrow_chassis";
  }
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_CuriosityPart).m_mesh_name,0,
             (char *)(this->super_CuriosityPart).m_mesh_name._M_string_length,(ulong)pcVar3);
LAB_00150b3f:
  auVar4._8_4_ = 0x3f800000;
  auVar4._0_8_ = 0x3f8000003f800000;
  auVar4._12_4_ = 0x3f800000;
  uVar1 = vmovlps_avx(auVar4);
  (this->super_CuriosityPart).m_color.R = (float)(int)uVar1;
  (this->super_CuriosityPart).m_color.G = (float)(int)((ulong)uVar1 >> 0x20);
  (this->super_CuriosityPart).m_color.B = 1.0;
  return;
}

Assistant:

CuriosityChassis::CuriosityChassis(const std::string& name,
                                   CuriosityChassisType chassis_type,
                                   std::shared_ptr<ChMaterialSurface> mat)
    : CuriosityPart(name, ChFrame<>(VNULL, QUNIT), mat, false), m_chassis_type(chassis_type) {
    switch (m_chassis_type) {
        case CuriosityChassisType::FullRover:
            m_mass = 750;
            m_inertia = ChVector<>(0.85, 0.85, 1.0) * m_mass;
            m_cog = ChFrame<>();
            m_mesh_name = "curiosity_chassis";
            break;

        case CuriosityChassisType::Scarecrow:
            m_mass = 200;
            m_inertia = ChVector<>(0.4, 0.4, 0.5) * m_mass;
            m_cog = ChFrame<>();
            m_mesh_name = "scarecrow_chassis";
            break;
    }
    m_color = ChColor(1.0f, 1.0f, 1.0f);
}